

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_sqrt(sexp ctx,sexp z)

{
  sexp_gc_var_t *psVar1;
  int iVar2;
  sexp psVar3;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  double r;
  double y;
  double x;
  sexp in_stack_ffffffffffffffa8;
  sexp in_stack_ffffffffffffffb0;
  undefined8 f;
  sexp in_stack_ffffffffffffffb8;
  sexp local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_18 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x130631);
  local_20 = sexp_to_double(in_stack_ffffffffffffffa8,(sexp)0x13064a);
  local_30 = (sexp)0x43e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  psVar3 = (sexp)&local_30;
  psVar1 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  local_28 = sqrt((double)local_18 * (double)local_18 + (double)local_20 * (double)local_20);
  local_30 = sexp_make_complex(psVar3,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  sqrt(((double)local_18 + (double)local_28) / 2.0);
  psVar3 = sexp_make_flonum(in_stack_ffffffffffffffb8,(double)in_stack_ffffffffffffffb0);
  (local_30->value).type.name = psVar3;
  iVar2 = 1;
  if ((double)local_20 < -0.0) {
    iVar2 = -1;
  }
  psVar3 = (sexp)(double)iVar2;
  f = local_8;
  sqrt((-(double)local_18 + (double)local_28) / 2.0);
  psVar3 = sexp_make_flonum(psVar3,(double)f);
  (local_30->value).type.cpl = psVar3;
  (((sexp)local_8)->value).context.saves = psVar1;
  return local_30;
}

Assistant:

sexp sexp_complex_sqrt (sexp ctx, sexp z) {
  double x = sexp_to_double(ctx, sexp_complex_real(z)),
    y = sexp_to_double(ctx, sexp_complex_imag(z)), r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  r = sqrt(x*x + y*y);
  res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(res) = sexp_make_flonum(ctx, sqrt((x+r)/2));
  sexp_complex_imag(res) = sexp_make_flonum(ctx, ((y<-0.0)?-1:1)*sqrt((-x+r)/2));
  sexp_gc_release1(ctx);
  return res;
}